

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * pbrt::Translate(Vector3f *delta)

{
  int in_ESI;
  Transform *in_RDI;
  int unaff_retaddr;
  SquareMatrix<4> minv;
  SquareMatrix<4> m;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff44;
  Transform *pTVar4;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  Float in_stack_ffffffffffffff8c;
  SquareMatrix<4> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  int args_10;
  
  args_10 = (int)((ulong)in_RDI >> 0x20);
  pTVar4 = in_RDI;
  SquareMatrix<4>::SquareMatrix<int,int,float,int,int,int,float,int,int,int,float,int,int,int,int>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,args_10,SUB84(in_RDI,0),in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0,(float)args_10,
             in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,in_ESI,unaff_retaddr);
  uVar1 = 0;
  uVar2 = 1;
  uVar3 = 0;
  SquareMatrix<4>::SquareMatrix<int,int,float,int,int,int,float,int,int,int,float,int,int,int,int>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,(int)((ulong)pTVar4 >> 0x20),SUB84(pTVar4,0),
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0,
             (float)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,
             in_ESI,unaff_retaddr);
  Transform::Transform
            ((Transform *)CONCAT44(in_stack_ffffffffffffff44,uVar3),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff3c,uVar2),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff34,uVar1));
  return pTVar4;
}

Assistant:

Transform Translate(const Vector3f &delta) {
    SquareMatrix<4> m(1, 0, 0, delta.x,
                      0, 1, 0, delta.y,
                      0, 0, 1, delta.z,
                      0, 0, 0, 1);
    SquareMatrix<4> minv(1, 0, 0, -delta.x,
                         0, 1, 0, -delta.y,
                         0, 0, 1, -delta.z,
                         0, 0, 0, 1);
    return Transform(m, minv);
}